

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImFontAtlasBuildPackCustomRects(ImFontAtlas *atlas,void *pack_context_opaque)

{
  ushort uVar1;
  ushort uVar2;
  uint num_rects;
  CustomRect *pCVar3;
  long lVar4;
  ulong uVar5;
  char *__function;
  long lVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ImVector<stbrp_rect> pack_rects;
  stbrp_rect *psStack_30;
  
  num_rects = (atlas->CustomRects).Size;
  if ((int)num_rects < 1) {
    __assert_fail("user_rects.Size >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                  ,0x78d,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
  }
  psStack_30 = (stbrp_rect *)0x0;
  if (0 < (int)num_rects) {
    uVar8 = 8;
    if (7 < (int)num_rects) {
      uVar8 = num_rects;
    }
    if (0 < (int)uVar8) {
      psStack_30 = (stbrp_rect *)ImGui::MemAlloc((ulong)uVar8 << 4);
    }
  }
  uVar9 = 0;
  memset(psStack_30,0,(long)(atlas->CustomRects).Size << 4);
  lVar4 = (long)(atlas->CustomRects).Size;
  if (0 < lVar4) {
    uVar5 = (ulong)num_rects;
    if ((int)num_rects < 1) {
      uVar5 = uVar9;
    }
    do {
      if (uVar5 * 0x10 == uVar9) goto LAB_001af8ed;
      pCVar3 = (atlas->CustomRects).Data;
      *(unsigned_short *)((long)&psStack_30->w + uVar9) = (&pCVar3->Width)[uVar9];
      *(unsigned_short *)((long)&psStack_30->h + uVar9) = (&pCVar3->Height)[uVar9];
      uVar9 = uVar9 + 0x10;
    } while (lVar4 * 0x10 != uVar9);
  }
  if ((int)num_rects < 1) {
LAB_001af8ed:
    __function = "value_type &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]";
LAB_001af919:
    __assert_fail("i < Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                  ,0x4c0,__function);
  }
  stbrp_pack_rects((stbrp_context *)pack_context_opaque,psStack_30,num_rects);
  if (0 < (long)(int)num_rects) {
    lVar4 = 0xc;
    lVar6 = 0;
    do {
      if (*(int *)((long)&psStack_30->id + lVar4) != 0) {
        if ((atlas->CustomRects).Size <= lVar6) {
          __function = 
          "value_type &ImVector<ImFontAtlas::CustomRect>::operator[](int) [T = ImFontAtlas::CustomRect]"
          ;
          goto LAB_001af919;
        }
        pCVar3 = (atlas->CustomRects).Data;
        *(undefined2 *)((long)pCVar3 + lVar4 * 2 + -0x10) =
             *(undefined2 *)((long)psStack_30 + lVar4 + -4);
        uVar1 = *(ushort *)((long)psStack_30 + lVar4 + -2);
        *(ushort *)((long)pCVar3 + lVar4 * 2 + -0xe) = uVar1;
        if ((*(short *)((long)psStack_30 + lVar4 + -8) !=
             *(short *)((long)pCVar3 + lVar4 * 2 + -0x14)) ||
           (uVar2 = *(ushort *)((long)psStack_30 + lVar4 + -6),
           uVar2 != *(ushort *)((long)pCVar3 + lVar4 * 2 + -0x12))) {
          __assert_fail("pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                        ,0x79d,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
        }
        iVar7 = (uint)uVar2 + (uint)uVar1;
        if (iVar7 < atlas->TexHeight) {
          iVar7 = atlas->TexHeight;
        }
        atlas->TexHeight = iVar7;
      }
      lVar6 = lVar6 + 1;
      lVar4 = lVar4 + 0x10;
    } while ((int)num_rects != lVar6);
  }
  if (psStack_30 != (stbrp_rect *)0x0) {
    ImGui::MemFree(psStack_30);
  }
  return;
}

Assistant:

void ImFontAtlasBuildPackCustomRects(ImFontAtlas* atlas, void* pack_context_opaque)
{
    stbrp_context* pack_context = (stbrp_context*)pack_context_opaque;

    ImVector<ImFontAtlas::CustomRect>& user_rects = atlas->CustomRects;
    IM_ASSERT(user_rects.Size >= 1); // We expect at least the default custom rects to be registered, else something went wrong.

    ImVector<stbrp_rect> pack_rects;
    pack_rects.resize(user_rects.Size);
    memset(pack_rects.Data, 0, sizeof(stbrp_rect) * user_rects.Size);
    for (int i = 0; i < user_rects.Size; i++)
    {
        pack_rects[i].w = user_rects[i].Width;
        pack_rects[i].h = user_rects[i].Height;
    }
    stbrp_pack_rects(pack_context, &pack_rects[0], pack_rects.Size);
    for (int i = 0; i < pack_rects.Size; i++)
        if (pack_rects[i].was_packed)
        {
            user_rects[i].X = pack_rects[i].x;
            user_rects[i].Y = pack_rects[i].y;
            IM_ASSERT(pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height);
            atlas->TexHeight = ImMax(atlas->TexHeight, pack_rects[i].y + pack_rects[i].h);
        }
}